

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::
emplaceRealloc<slang::parsing::Preprocessor::BranchEntry>
          (SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *this,pointer pos,
          BranchEntry *args)

{
  ulong uVar1;
  pointer p;
  Info *pIVar2;
  bool bVar3;
  bool bVar4;
  undefined5 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  pointer pBVar9;
  long lVar10;
  pointer pBVar11;
  pointer pBVar12;
  long lVar13;
  size_type sVar14;
  ulong uVar15;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar15 = this->len + 1;
  uVar1 = this->cap;
  if (uVar15 < uVar1 * 2) {
    uVar15 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar15 = 0x555555555555555;
  }
  lVar13 = (long)pos - (long)this->data_;
  pBVar9 = (pointer)operator_new(uVar15 * 0x18);
  *(undefined8 *)((long)pBVar9 + lVar13 + 0x10) = *(undefined8 *)&args->anyTaken;
  pIVar2 = (args->directive).info;
  *(undefined8 *)((long)pBVar9 + lVar13) = *(undefined8 *)&args->directive;
  ((undefined8 *)((long)pBVar9 + lVar13))[1] = pIVar2;
  p = this->data_;
  sVar14 = this->len;
  lVar10 = (long)p + (sVar14 * 0x18 - (long)pos);
  pBVar11 = p;
  pBVar12 = pBVar9;
  if (lVar10 == 0) {
    pBVar11 = pBVar9;
    pBVar12 = p;
    if (sVar14 != 0) {
      do {
        bVar3 = pBVar12->currentActive;
        bVar4 = pBVar12->hasElse;
        uVar5 = *(undefined5 *)&pBVar12->field_0x13;
        pBVar11->anyTaken = pBVar12->anyTaken;
        pBVar11->currentActive = bVar3;
        pBVar11->hasElse = bVar4;
        *(undefined5 *)&pBVar11->field_0x13 = uVar5;
        uVar6 = (pBVar12->directive).field_0x2;
        NVar7.raw = (pBVar12->directive).numFlags.raw;
        uVar8 = (pBVar12->directive).rawLen;
        pIVar2 = (pBVar12->directive).info;
        (pBVar11->directive).kind = (pBVar12->directive).kind;
        (pBVar11->directive).field_0x2 = uVar6;
        (pBVar11->directive).numFlags = (NumericTokenFlags)NVar7.raw;
        (pBVar11->directive).rawLen = uVar8;
        (pBVar11->directive).info = pIVar2;
        pBVar12 = pBVar12 + 1;
        pBVar11 = pBVar11 + 1;
      } while (pBVar12 != pos);
    }
  }
  else {
    for (; pBVar11 != pos; pBVar11 = pBVar11 + 1) {
      bVar3 = pBVar11->currentActive;
      bVar4 = pBVar11->hasElse;
      uVar5 = *(undefined5 *)&pBVar11->field_0x13;
      pBVar12->anyTaken = pBVar11->anyTaken;
      pBVar12->currentActive = bVar3;
      pBVar12->hasElse = bVar4;
      *(undefined5 *)&pBVar12->field_0x13 = uVar5;
      uVar6 = (pBVar11->directive).field_0x2;
      NVar7.raw = (pBVar11->directive).numFlags.raw;
      uVar8 = (pBVar11->directive).rawLen;
      pIVar2 = (pBVar11->directive).info;
      (pBVar12->directive).kind = (pBVar11->directive).kind;
      (pBVar12->directive).field_0x2 = uVar6;
      (pBVar12->directive).numFlags = (NumericTokenFlags)NVar7.raw;
      (pBVar12->directive).rawLen = uVar8;
      (pBVar12->directive).info = pIVar2;
      pBVar12 = pBVar12 + 1;
    }
    memcpy((void *)((long)pBVar9 + lVar13 + 0x18),pos,((lVar10 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar14 = this->len;
  }
  this->len = sVar14 + 1;
  this->cap = uVar15;
  this->data_ = pBVar9;
  return (pointer)((long)pBVar9 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}